

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl-client.c
# Opt level: O0

lws_ssl_capable_status lws_tls_client_connect(lws *wsi)

{
  int n_00;
  int iVar1;
  int iVar2;
  int *piVar3;
  int n;
  int m;
  uint len;
  char a [32];
  void *local_20;
  uchar *prot;
  lws *wsi_local;
  
  prot = (uchar *)wsi;
  piVar3 = __errno_location();
  *piVar3 = 0;
  ERR_clear_error();
  n_00 = SSL_connect(*(SSL **)(prot + 0x290));
  if (n_00 == 1) {
    SSL_get0_alpn_selected(*(undefined8 *)(prot + 0x290),&local_20,&n);
    if (0x1f < (uint)n) {
      n = 0x1f;
    }
    memcpy(&m,local_20,(ulong)(uint)n);
    *(undefined1 *)((long)&m + (ulong)(uint)n) = 0;
    lws_role_call_alpn_negotiated((lws *)prot,(char *)&m);
    _lws_log(8,"client connect OK\n");
    lws_openssl_describe_cipher((lws *)prot);
    wsi_local._4_4_ = LWS_SSL_CAPABLE_DONE;
  }
  else {
    iVar1 = lws_ssl_get_error((lws *)prot,n_00);
    if ((iVar1 == 5) || (iVar1 == 1)) {
      wsi_local._4_4_ = LWS_SSL_CAPABLE_ERROR;
    }
    else {
      if ((iVar1 != 2) && (iVar2 = SSL_want(*(SSL **)(prot + 0x290)), iVar2 != 3)) {
        if ((iVar1 != 3) && (iVar1 = SSL_want(*(SSL **)(prot + 0x290)), iVar1 != 2)) {
          if (n_00 == 0) {
            return LWS_SSL_CAPABLE_MORE_SERVICE;
          }
          return LWS_SSL_CAPABLE_ERROR;
        }
        return LWS_SSL_CAPABLE_MORE_SERVICE_WRITE;
      }
      wsi_local._4_4_ = LWS_SSL_CAPABLE_MORE_SERVICE_READ;
    }
  }
  return wsi_local._4_4_;
}

Assistant:

enum lws_ssl_capable_status
lws_tls_client_connect(struct lws *wsi)
{
#if defined(LWS_HAVE_SSL_set_alpn_protos) && \
    defined(LWS_HAVE_SSL_get0_alpn_selected)
	const unsigned char *prot;
	char a[32];
	unsigned int len;
#endif
	int m, n;

	errno = 0;
	ERR_clear_error();
	n = SSL_connect(wsi->tls.ssl);
	if (n == 1) {
#if defined(LWS_HAVE_SSL_set_alpn_protos) && \
    defined(LWS_HAVE_SSL_get0_alpn_selected)
		SSL_get0_alpn_selected(wsi->tls.ssl, &prot, &len);

		if (len >= sizeof(a))
			len = sizeof(a) - 1;
		memcpy(a, (const char *)prot, len);
		a[len] = '\0';

		lws_role_call_alpn_negotiated(wsi, (const char *)a);
#endif
		lwsl_info("client connect OK\n");
		lws_openssl_describe_cipher(wsi);
		return LWS_SSL_CAPABLE_DONE;
	}

	m = lws_ssl_get_error(wsi, n);

	if (m == SSL_ERROR_SYSCALL || m == SSL_ERROR_SSL)
		return LWS_SSL_CAPABLE_ERROR;

	if (m == SSL_ERROR_WANT_READ || SSL_want_read(wsi->tls.ssl))
		return LWS_SSL_CAPABLE_MORE_SERVICE_READ;

	if (m == SSL_ERROR_WANT_WRITE || SSL_want_write(wsi->tls.ssl))
		return LWS_SSL_CAPABLE_MORE_SERVICE_WRITE;

	if (!n) /* we don't know what he wants, but he says to retry */
		return LWS_SSL_CAPABLE_MORE_SERVICE;

	return LWS_SSL_CAPABLE_ERROR;
}